

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::ResonanceRange::ResonanceRange
          (ResonanceRange *this,double el,double eh,int naps,ResonanceParameters *parameters,
          optional<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
          *scatteringRadius)

{
  bool NRO;
  int NAPS;
  int LRU;
  int LRF;
  
  this->el_ = el;
  this->eh_ = eh;
  this->naps_ = naps;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     *)&this->parameters_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<32,_151>::LimitedSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::LimitedMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::GeneralReichMoore,_njoy::ENDFtk::section::Type<32,_151>::GeneralRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::CompactSingleLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactMultiLevelBreitWigner,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore,_njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimited,_njoy::ENDFtk::section::Type<32,_151>::UnresolvedRelativeCovariances>
                     *)parameters);
  std::
  _Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>::
  _Optional_base(&(this->scattering_radius_).
                  super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
                 ,&scatteringRadius->
                   super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
                );
  NRO = (this->scattering_radius_).
        super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_false,_false>
        ._M_payload.
        super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances,_true,_false,_false>
        .
        super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances>
        ._M_engaged;
  NAPS = this->naps_;
  LRU = ResonanceRange::LRU(this);
  LRF = ResonanceRange::LRF(this);
  verifyOptions(NRO,NAPS,LRU,LRF);
  return;
}

Assistant:

ResonanceRange( double el, double eh, int naps,
                ResonanceParameters&& parameters,
                std::optional< ScatteringRadiusCovariances >&& scatteringRadius = std::nullopt )
  try : el_( el ), eh_( eh ), naps_( naps ),
        parameters_( std::move( parameters ) ),
        scattering_radius_( std::move( scatteringRadius ) ) {

    verifyOptions( this->NRO(), this->NAPS(), this->LRU(), this->LRF() );
  }
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing a resonance range" );
    throw;
  }